

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jitallocator.cpp
# Opt level: O0

void __thiscall
asmjit::v1_14::JitAllocatorBlock::markAllocatedArea
          (JitAllocatorBlock *this,uint32_t allocatedAreaStart,uint32_t allocatedAreaEnd)

{
  JitAllocatorPool *pJVar1;
  uint uVar2;
  bool bVar3;
  uint32_t uVar4;
  uint uVar5;
  uint32_t in_EDX;
  uint in_ESI;
  JitAllocatorBlock *in_RDI;
  uint32_t allocatedAreaSize;
  
  uVar5 = in_EDX - in_ESI;
  Support::Internal::
  bitVectorOp<unsigned_long,asmjit::v1_14::Support::Or,asmjit::v1_14::Support::Set>
            (in_RDI->_usedBitVector,(ulong)in_ESI,(ulong)uVar5);
  uVar2 = in_EDX - 1 >> 6;
  in_RDI->_stopBitVector[uVar2] = 1L << ((byte)(in_EDX - 1) & 0x3f) | in_RDI->_stopBitVector[uVar2];
  pJVar1 = in_RDI->_pool;
  bVar3 = hasLargePages((JitAllocatorBlock *)0x146e70);
  pJVar1->totalAreaUsed[bVar3] = (ulong)uVar5 + pJVar1->totalAreaUsed[bVar3];
  in_RDI->_areaUsed = uVar5 + in_RDI->_areaUsed;
  uVar4 = areaAvailable(in_RDI);
  if (uVar4 == 0) {
    in_RDI->_searchStart = in_RDI->_areaSize;
    in_RDI->_searchEnd = 0;
    in_RDI->_largestUnusedArea = 0;
    clearFlags(in_RDI,6);
  }
  else {
    if (in_RDI->_searchStart == in_ESI) {
      in_RDI->_searchStart = in_EDX;
    }
    if (in_RDI->_searchEnd == in_EDX) {
      in_RDI->_searchEnd = in_ESI;
    }
    addFlags(in_RDI,4);
    clearFlags(in_RDI,2);
  }
  return;
}

Assistant:

inline void markAllocatedArea(uint32_t allocatedAreaStart, uint32_t allocatedAreaEnd) noexcept {
    uint32_t allocatedAreaSize = allocatedAreaEnd - allocatedAreaStart;

    // Mark the newly allocated space as occupied and also the sentinel.
    Support::bitVectorFill(_usedBitVector, allocatedAreaStart, allocatedAreaSize);
    Support::bitVectorSetBit(_stopBitVector, allocatedAreaEnd - 1, true);

    // Update search region and statistics.
    _pool->totalAreaUsed[size_t(hasLargePages())] += allocatedAreaSize;
    _areaUsed += allocatedAreaSize;

    if (areaAvailable() == 0) {
      _searchStart = _areaSize;
      _searchEnd = 0;
      _largestUnusedArea = 0;

      clearFlags(kFlagDirty | kFlagEmpty);
    }
    else {
      if (_searchStart == allocatedAreaStart)
        _searchStart = allocatedAreaEnd;
      if (_searchEnd == allocatedAreaEnd)
        _searchEnd = allocatedAreaStart;

      addFlags(kFlagDirty);
      clearFlags(kFlagEmpty);
    }
  }